

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

void btNearestPointInLineSegment
               (btVector3 *point,btVector3 *line0,btVector3 *line1,btVector3 *nearestPoint)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar4 = (float)*(undefined8 *)line0->m_floats;
  fVar5 = (float)((ulong)*(undefined8 *)line0->m_floats >> 0x20);
  fVar6 = (float)*(undefined8 *)line1->m_floats - fVar4;
  fVar7 = (float)((ulong)*(undefined8 *)line1->m_floats >> 0x20) - fVar5;
  fVar1 = line0->m_floats[2];
  fVar8 = line1->m_floats[2] - fVar1;
  fVar10 = fVar8 * fVar8 + fVar6 * fVar6 + fVar7 * fVar7;
  if (fVar10 < 1.4210855e-14) {
    uVar3 = *(undefined8 *)(line0->m_floats + 2);
    *(undefined8 *)nearestPoint->m_floats = *(undefined8 *)line0->m_floats;
    *(undefined8 *)(nearestPoint->m_floats + 2) = uVar3;
    return;
  }
  fVar10 = ((point->m_floats[2] - fVar1) * fVar8 +
           (point->m_floats[0] - fVar4) * fVar6 + (point->m_floats[1] - fVar5) * fVar7) / fVar10;
  fVar9 = 0.0;
  if ((0.0 <= fVar10) && (fVar9 = fVar10, 1.0 < fVar10)) {
    fVar9 = 1.0;
  }
  auVar2._4_4_ = fVar5 + fVar7 * fVar9;
  auVar2._0_4_ = fVar4 + fVar6 * fVar9;
  auVar2._8_4_ = fVar1 + fVar8 * fVar9;
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])nearestPoint->m_floats = auVar2;
  return;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator-(const btVector3& v1, const btVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API)  && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return btVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(
			v1.m_floats[0] - v2.m_floats[0],
			v1.m_floats[1] - v2.m_floats[1],
			v1.m_floats[2] - v2.m_floats[2]);
#endif
}